

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 CalcWindowAutoFitSize(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImGuiContext *pIVar1;
  ImGuiViewport *pIVar2;
  byte bVar3;
  char cVar4;
  ImGuiContext *g;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float extraout_XMM0_Db;
  float fVar13;
  ImVec2 IVar11;
  undefined1 auVar12 [16];
  float fVar14;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pIVar1 = GImGui;
  fVar8 = 0.0;
  if ((window->Flags & 1) == 0) {
    fVar8 = GImGui->FontBaseSize * window->FontWindowScale;
    if (window->ParentWindow != (ImGuiWindow *)0x0) {
      fVar8 = fVar8 * window->ParentWindow->FontWindowScale;
    }
    fVar22 = (GImGui->Style).FramePadding.y;
    fVar8 = fVar22 + fVar22 + fVar8;
  }
  fVar9 = ImGuiWindow::MenuBarHeight(window);
  fVar22 = (window->WindowPadding).x;
  fVar21 = (window->WindowPadding).y;
  fVar22 = fVar22 + fVar22;
  fVar21 = fVar21 + fVar21;
  fVar14 = size_contents->x + fVar22;
  fVar17 = fVar9 + fVar8 + size_contents->y + fVar21;
  fVar19 = extraout_XMM0_Db + 0.0;
  if (((uint)window->Flags >> 0x19 & 1) == 0) {
    auVar23._8_8_ = 0;
    auVar23._0_4_ = (pIVar1->Style).WindowMinSize.x;
    auVar23._4_4_ = (pIVar1->Style).WindowMinSize.y;
    if ((window->Flags & 0x14000000U) != 0) {
      auVar23 = minps(auVar23,_DAT_003472c0);
    }
    pIVar2 = ImGui::GetMainViewport();
    IVar11 = (pIVar1->Style).DisplaySafeAreaPadding;
    fVar10 = IVar11.x;
    fVar13 = IVar11.y;
    fVar10 = (pIVar2->Size).x - (fVar10 + fVar10);
    fVar13 = (pIVar2->Size).y - (fVar13 + fVar13);
    local_48 = auVar23._0_4_;
    fStack_44 = auVar23._4_4_;
    fStack_40 = auVar23._8_4_;
    fStack_3c = auVar23._12_4_;
    uVar5 = -(uint)(fVar10 <= local_48);
    uVar6 = -(uint)(fVar13 <= fStack_44);
    fVar18 = (float)((uint)fStack_40 & -(uint)(0.0 <= fStack_40));
    fVar20 = (float)((uint)fStack_3c & -(uint)(0.0 <= fStack_3c));
    fVar10 = (float)(~uVar5 & (uint)fVar10 | (uint)local_48 & uVar5);
    fVar13 = (float)(~uVar6 & (uint)fVar13 | (uint)fStack_44 & uVar6);
    uVar5 = -(uint)(fVar10 < fVar14);
    uVar6 = -(uint)(fVar13 < fVar17);
    uVar7 = -(uint)(fVar20 < fVar19);
    auVar24._0_4_ = (uint)local_48 & -(uint)(fVar14 < local_48);
    auVar24._4_4_ = (uint)fStack_44 & -(uint)(fVar17 < fStack_44);
    auVar24._8_4_ = (uint)fStack_40 & -(uint)(0.0 < fStack_40);
    auVar24._12_4_ = (uint)fStack_3c & -(uint)(fVar19 < fStack_3c);
    auVar15._0_4_ =
         ~-(uint)(fVar14 < local_48) & (~uVar5 & (uint)(fVar14 + 0.0) | (uint)fVar10 & uVar5);
    auVar15._4_4_ = ~-(uint)(fVar17 < fStack_44) & (~uVar6 & (uint)fVar17 | (uint)fVar13 & uVar6);
    auVar15._8_4_ = ~-(uint)(0.0 < fStack_40) & (uint)fVar18 & -(uint)(fVar18 < 0.0);
    auVar15._12_4_ = ~-(uint)(fVar19 < fStack_3c) & (~uVar7 & (uint)fVar19 | (uint)fVar20 & uVar7);
    auVar16 = auVar15 | auVar24;
    IVar11 = CalcWindowSizeAfterConstraint(window,auVar16._0_8_);
    uVar5 = window->Flags;
    bVar3 = 1;
    cVar4 = '\x01';
    if (size_contents->x <= IVar11.x - fVar22 || (uVar5 & 0x808) != 0x800) {
      cVar4 = (char)((uVar5 & 0xffff) >> 0xf);
    }
    if (size_contents->y <= (IVar11.y - fVar21) - (fVar9 + fVar8) || (uVar5 & 8) != 0) {
      bVar3 = (byte)(uVar5 >> 0xe) & 1;
    }
    if (cVar4 != '\0') {
      auVar16._4_4_ = auVar16._4_4_ + (pIVar1->Style).ScrollbarSize;
    }
    IVar11 = auVar16._0_8_;
    if (bVar3 != 0) {
      auVar12._4_12_ = auVar16._4_12_;
      auVar12._0_4_ = auVar16._0_4_ + (pIVar1->Style).ScrollbarSize;
      IVar11 = auVar12._0_8_;
    }
  }
  else {
    IVar11.y = fVar17;
    IVar11.x = fVar14 + 0.0;
  }
  return IVar11;
}

Assistant:

static ImVec2 CalcWindowAutoFitSize(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    const float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
    ImVec2 size_pad = window->WindowPadding * 2.0f;
    ImVec2 size_desired = size_contents + size_pad + ImVec2(0.0f, decoration_up_height);
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_desired;
    }
    else
    {
        // Maximum window size is determined by the viewport size or monitor size
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));

        // FIXME-VIEWPORT-WORKAREA: May want to use GetWorkSize() instead of Size depending on the type of windows?
        ImVec2 avail_size = ImGui::GetMainViewport()->Size;
        ImVec2 size_auto_fit = ImClamp(size_desired, size_min, ImMax(size_min, avail_size - style.DisplaySafeAreaPadding * 2.0f));

        // When the window cannot fit all contents (either because of constraints, either because screen is too small),
        // we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than ViewportSize-WindowPadding.
        ImVec2 size_auto_fit_after_constraint = CalcWindowSizeAfterConstraint(window, size_auto_fit);
        bool will_have_scrollbar_x = (size_auto_fit_after_constraint.x - size_pad.x - 0.0f                 < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysHorizontalScrollbar);
        bool will_have_scrollbar_y = (size_auto_fit_after_constraint.y - size_pad.y - decoration_up_height < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysVerticalScrollbar);
        if (will_have_scrollbar_x)
            size_auto_fit.y += style.ScrollbarSize;
        if (will_have_scrollbar_y)
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}